

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_widgets.cpp
# Opt level: O0

bool ImGui::SliderAngle(char *label,float *v_rad,float v_degrees_min,float v_degrees_max,
                       char *format,ImGuiSliderFlags flags)

{
  bool bVar1;
  float local_30;
  ImGuiSliderFlags IStack_2c;
  bool value_changed;
  float v_deg;
  ImGuiSliderFlags flags_local;
  char *format_local;
  float v_degrees_max_local;
  float v_degrees_min_local;
  float *v_rad_local;
  char *label_local;
  
  _v_deg = format;
  if (format == (char *)0x0) {
    _v_deg = "%.0f deg";
  }
  local_30 = (*v_rad * 360.0) / 6.2831855;
  IStack_2c = flags;
  format_local._0_4_ = v_degrees_max;
  format_local._4_4_ = v_degrees_min;
  _v_degrees_max_local = v_rad;
  v_rad_local = (float *)label;
  bVar1 = SliderFloat(label,&local_30,v_degrees_min,v_degrees_max,_v_deg,flags);
  *_v_degrees_max_local = (local_30 * 6.2831855) / 360.0;
  return bVar1;
}

Assistant:

bool ImGui::SliderAngle(const char* label, float* v_rad, float v_degrees_min, float v_degrees_max, const char* format, ImGuiSliderFlags flags)
{
    if (format == NULL)
        format = "%.0f deg";
    float v_deg = (*v_rad) * 360.0f / (2 * IM_PI);
    bool value_changed = SliderFloat(label, &v_deg, v_degrees_min, v_degrees_max, format, flags);
    *v_rad = v_deg * (2 * IM_PI) / 360.0f;
    return value_changed;
}